

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O1

int amqp_raw_equal(char *first,char *second)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  
  cVar3 = *first;
  if (cVar3 != '\0') {
    pcVar4 = first + 1;
    do {
      cVar2 = *second;
      if (cVar2 == '\0') break;
      cVar1 = amqp_raw_toupper(cVar3);
      cVar2 = amqp_raw_toupper(cVar2);
      if (cVar1 != cVar2) break;
      second = second + 1;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  cVar3 = amqp_raw_toupper(cVar3);
  cVar2 = amqp_raw_toupper(*second);
  return (int)(cVar3 == cVar2);
}

Assistant:

static int
amqp_raw_equal(const char *first, const char *second)
{
  while (*first && *second) {
    if (amqp_raw_toupper(*first) != amqp_raw_toupper(*second)) {
      /* get out of the loop as soon as they don't match */
      break;
    }
    first++;
    second++;
  }
  /* we do the comparison here (possibly again), just to make sure that if
   * the loop above is skipped because one of the strings reached zero, we
   * must not return this as a successful match
   */
  return (amqp_raw_toupper(*first) == amqp_raw_toupper(*second));
}